

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ColumnSetColl(sqlite3 *db,Column *pCol,char *zColl)

{
  byte *pbVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  
  pcVar4 = pCol->zCnName;
  if (pcVar4 == (char *)0x0) {
    uVar2 = 1;
  }
  else {
    sVar3 = strlen(pcVar4);
    uVar2 = ((uint)sVar3 & 0x3fffffff) + 1;
  }
  uVar5 = (ulong)uVar2;
  if ((pCol->colFlags & 4) != 0) {
    sVar3 = strlen(pcVar4 + uVar5);
    uVar5 = (ulong)(uVar2 + ((uint)sVar3 & 0x3fffffff) + 1);
  }
  if (zColl == (char *)0x0) {
    sVar3 = 1;
  }
  else {
    sVar3 = strlen(zColl);
    sVar3 = (ulong)((uint)sVar3 & 0x3fffffff) + 1;
  }
  pcVar4 = (char *)sqlite3DbRealloc(db,pcVar4,sVar3 + uVar5);
  if (pcVar4 != (char *)0x0) {
    pCol->zCnName = pcVar4;
    memcpy(pcVar4 + uVar5,zColl,sVar3);
    pbVar1 = (byte *)((long)&pCol->colFlags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetColl(
  sqlite3 *db,
  Column *pCol,
  const char *zColl
){
  i64 nColl;
  i64 n;
  char *zNew;
  assert( zColl!=0 );
  n = sqlite3Strlen30(pCol->zCnName) + 1;
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    n += sqlite3Strlen30(pCol->zCnName+n) + 1;
  }
  nColl = sqlite3Strlen30(zColl) + 1;
  zNew = sqlite3DbRealloc(db, pCol->zCnName, nColl+n);
  if( zNew ){
    pCol->zCnName = zNew;
    memcpy(pCol->zCnName + n, zColl, nColl);
    pCol->colFlags |= COLFLAG_HASCOLL;
  }
}